

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

void __thiscall QToolBox::setItemEnabled(QToolBox *this,int index,bool enabled)

{
  bool bVar1;
  int iVar2;
  QToolBoxPrivate *pQVar3;
  Page *pPVar4;
  size_type sVar5;
  byte in_DL;
  int in_ESI;
  QToolBoxPrivate *in_RDI;
  int count;
  int curIndexDown;
  int curIndexUp;
  Page *c;
  QToolBoxPrivate *d;
  undefined3 uVar6;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  int local_24;
  
  pQVar3 = d_func((QToolBox *)0x7040d8);
  pPVar4 = QToolBoxPrivate::page(in_RDI,in_stack_ffffffffffffffc4);
  if (((pPVar4 != (Page *)0x0) &&
      (QWidget::setEnabled((QWidget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           SUB81((ulong)in_RDI >> 0x38,0)), (in_DL & 1) == 0)) &&
     (pPVar4 == pQVar3->currentPage)) {
    sVar5 = std::
            vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
            ::size(&pQVar3->pageList);
    iVar2 = (int)sVar5;
    local_28 = in_ESI;
    local_24 = in_ESI;
    do {
      do {
        uVar6 = (undefined3)in_stack_ffffffffffffffc4;
        in_stack_ffffffffffffffc4 = CONCAT13(1,uVar6);
        if (local_24 < 1) {
          in_stack_ffffffffffffffc4 = CONCAT13(local_28 < iVar2 + -1,uVar6);
        }
        if ((char)((uint)in_stack_ffffffffffffffc4 >> 0x18) == '\0') goto LAB_007041fe;
        if (local_28 < iVar2 + -1) {
          local_28 = local_28 + 1;
          QToolBoxPrivate::page(in_RDI,in_stack_ffffffffffffffc4);
          bVar1 = QWidget::isEnabled((QWidget *)0x7041b1);
          if (bVar1) goto LAB_007041fe;
        }
      } while (local_24 < 1);
      local_24 = local_24 + -1;
      QToolBoxPrivate::page(in_RDI,in_stack_ffffffffffffffc4);
      bVar1 = QWidget::isEnabled((QWidget *)0x7041e7);
    } while (!bVar1);
LAB_007041fe:
    setCurrentIndex((QToolBox *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                    (int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void QToolBox::setItemEnabled(int index, bool enabled)
{
    Q_D(QToolBox);
    QToolBoxPrivate::Page *c = d->page(index);
    if (!c)
        return;

    c->button->setEnabled(enabled);
    if (!enabled && c == d->currentPage) {
        int curIndexUp = index;
        int curIndexDown = curIndexUp;
        const int count = static_cast<int>(d->pageList.size());
        while (curIndexUp > 0 || curIndexDown < count-1) {
            if (curIndexDown < count-1) {
                if (d->page(++curIndexDown)->button->isEnabled()) {
                    index = curIndexDown;
                    break;
                }
            }
            if (curIndexUp > 0) {
                if (d->page(--curIndexUp)->button->isEnabled()) {
                    index = curIndexUp;
                    break;
                }
            }
        }
        setCurrentIndex(index);
    }
}